

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.h
# Opt level: O2

void __thiscall
llvm::cl::opt<bool,false,llvm::cl::parser<bool>>::opt<char[14],llvm::cl::desc>
          (opt<bool,false,llvm::cl::parser<bool>> *this,char (*Ms) [14],desc *Ms_1)

{
  Option::Option((Option *)this,Optional,NotHidden);
  this[0x98] = (opt<bool,false,llvm::cl::parser<bool>>)0x0;
  *(undefined ***)(this + 0xa0) = &PTR_compare_00181588;
  *(undefined2 *)(this + 0xa8) = 0x100;
  *(undefined ***)this = &PTR_handleOccurrence_00181d10;
  *(undefined ***)(this + 0xb0) = &PTR_getValueName_00181800;
  apply<llvm::cl::opt<bool,false,llvm::cl::parser<bool>>,char[14],llvm::cl::desc>
            ((opt<bool,_false,_llvm::cl::parser<bool>_> *)this,Ms,Ms_1);
  Option::addArgument((Option *)this);
  return;
}

Assistant:

explicit opt(const Mods &... Ms)
      : Option(Optional, NotHidden), Parser(*this) {
    apply(this, Ms...);
    done();
  }